

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent indent)

{
  pointer pcVar1;
  pointer pbVar2;
  cmTest *pcVar3;
  cmTestGenerator *pcVar4;
  TargetType TVar5;
  cmListFileBacktrace *pcVar6;
  ostream *poVar7;
  cmGeneratorTarget *this_00;
  string *psVar8;
  _Base_ptr p_Var9;
  char *__s;
  size_t sVar10;
  pointer pbVar11;
  Indent IVar12;
  _Rb_tree_header *p_Var13;
  string emulatorExe;
  undefined1 local_c8 [32];
  cmTestGenerator *local_a8;
  string exe;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  cmGeneratorExpression ge;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  cmTest *local_38;
  
  this->TestGenerated = true;
  local_a8 = this;
  pcVar6 = cmTest::GetBacktrace(this->Test);
  local_48._M_allocated_capacity =
       (size_type)
       (pcVar6->TopEntry).
       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48._8_8_ =
       (pcVar6->TopEntry).
       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_)->_M_use_count + 1;
    }
  }
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  IVar12.Level = indent.Level;
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      IVar12.Level = IVar12.Level + -1;
    } while (IVar12.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"add_test(",9);
  exe._M_dataplus._M_p = (pointer)&exe.field_2;
  pcVar1 = (local_a8->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&exe,pcVar1,pcVar1 + (local_a8->Test->Name)._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,exe._M_dataplus._M_p,exe._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exe._M_dataplus._M_p != &exe.field_2) {
    operator_delete(exe._M_dataplus._M_p,exe.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = local_a8;
  local_38 = local_a8->Test;
  pbVar2 = (local_38->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  exe._M_dataplus._M_p = (pointer)&exe.field_2;
  pcVar1 = (pbVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&exe,pcVar1,pcVar1 + pbVar2->_M_string_length)
  ;
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar4->LG,&exe);
  if ((this_00 == (cmGeneratorTarget *)0x0) ||
     (TVar5 = cmGeneratorTarget::GetType(this_00), TVar5 != EXECUTABLE)) {
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_c8,(string *)&ge);
    emulatorExe._M_string_length = 0;
    emulatorExe.field_2._M_local_buf[0] = '\0';
    emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)local_c8._0_8_,local_a8->LG,config,false,
               (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,&emulatorExe);
    std::__cxx11::string::_M_assign((string *)&exe);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
      operator_delete(emulatorExe._M_dataplus._M_p,
                      CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                               emulatorExe.field_2._M_local_buf[0]) + 1);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_c8);
    cmsys::SystemTools::ConvertToUnixSlashes(&exe);
  }
  else {
    cmGeneratorTarget::GetFullPath(&emulatorExe,this_00,config,RuntimeBinaryArtifact,false);
    std::__cxx11::string::operator=((string *)&exe,(string *)&emulatorExe);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
      operator_delete(emulatorExe._M_dataplus._M_p,
                      CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                               emulatorExe.field_2._M_local_buf[0]) + 1);
    }
    emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&emulatorExe,"CROSSCOMPILING_EMULATOR","");
    __s = cmGeneratorTarget::GetProperty(this_00,&emulatorExe);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
      operator_delete(emulatorExe._M_dataplus._M_p,
                      CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                               emulatorExe.field_2._M_local_buf[0]) + 1);
    }
    if ((__s != (char *)0x0) && (*__s != '\0')) {
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      emulatorWithArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
      sVar10 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&emulatorExe,__s,__s + sVar10);
      cmSystemTools::ExpandListArgument(&emulatorExe,&emulatorWithArgs,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
        operator_delete(emulatorExe._M_dataplus._M_p,
                        CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                                 emulatorExe.field_2._M_local_buf[0]) + 1);
      }
      emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
      pcVar1 = ((emulatorWithArgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&emulatorExe,pcVar1,
                 pcVar1 + (emulatorWithArgs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      cmsys::SystemTools::ConvertToUnixSlashes(&emulatorExe);
      cmOutputConverter::EscapeForCMake((string *)local_c8,&emulatorExe);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)local_c8._0_8_,local_c8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      if ((cmCompiledGeneratorExpression *)local_c8._0_8_ !=
          (cmCompiledGeneratorExpression *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
      }
      pbVar2 = emulatorWithArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar8 = emulatorWithArgs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      if (psVar8 != emulatorWithArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmOutputConverter::EscapeForCMake((string *)local_c8,psVar8);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,(char *)local_c8._0_8_,local_c8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          if ((cmCompiledGeneratorExpression *)local_c8._0_8_ !=
              (cmCompiledGeneratorExpression *)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
          }
          psVar8 = psVar8 + 1;
        } while (psVar8 != pbVar2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
        operator_delete(emulatorExe._M_dataplus._M_p,
                        CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                                 emulatorExe.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&emulatorWithArgs);
    }
  }
  cmOutputConverter::EscapeForCMake(&emulatorExe,&exe);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,emulatorExe._M_dataplus._M_p,emulatorExe._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
    operator_delete(emulatorExe._M_dataplus._M_p,
                    CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                             emulatorExe.field_2._M_local_buf[0]) + 1);
  }
  pbVar2 = (local_38->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar11 = (local_38->Command).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1;
  if (pbVar11 != pbVar2) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)&emulatorWithArgs,(string *)&ge);
      local_c8._0_8_ = (long)local_c8 + 0x10;
      local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8[0x10] = '\0';
      psVar8 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)
                          emulatorWithArgs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,local_a8->LG,config,false,
                          (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                          (cmGeneratorExpressionDAGChecker *)0x0,(string *)local_c8);
      cmOutputConverter::EscapeForCMake(&emulatorExe,psVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,emulatorExe._M_dataplus._M_p,emulatorExe._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
        operator_delete(emulatorExe._M_dataplus._M_p,
                        CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                                 emulatorExe.field_2._M_local_buf[0]) + 1);
      }
      if ((cmCompiledGeneratorExpression *)local_c8._0_8_ !=
          (cmCompiledGeneratorExpression *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
      }
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&emulatorWithArgs);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  pcVar3 = local_a8->Test;
  if (0 < indent.Level) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      indent.Level = indent.Level + -1;
    } while (indent.Level != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties(",0x15);
  emulatorExe._M_dataplus._M_p = (pointer)&emulatorExe.field_2;
  pcVar1 = (local_a8->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&emulatorExe,pcVar1,pcVar1 + (local_a8->Test->Name)._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,emulatorExe._M_dataplus._M_p,emulatorExe._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," PROPERTIES ",0xc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
    operator_delete(emulatorExe._M_dataplus._M_p,
                    CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                             emulatorExe.field_2._M_local_buf[0]) + 1);
  }
  p_Var9 = (pcVar3->Properties).
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var13 = &(pcVar3->Properties).
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
             ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var13) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      cmProperty::GetValue((cmProperty *)(p_Var9 + 2));
      cmGeneratorExpression::Parse((cmGeneratorExpression *)&emulatorWithArgs,(char *)&ge);
      local_c8._0_8_ = (long)local_c8 + 0x10;
      local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8[0x10] = '\0';
      psVar8 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)
                          emulatorWithArgs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,local_a8->LG,config,false,
                          (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                          (cmGeneratorExpressionDAGChecker *)0x0,(string *)local_c8);
      cmOutputConverter::EscapeForCMake(&emulatorExe,psVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,emulatorExe._M_dataplus._M_p,emulatorExe._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)emulatorExe._M_dataplus._M_p != &emulatorExe.field_2) {
        operator_delete(emulatorExe._M_dataplus._M_p,
                        CONCAT71(emulatorExe.field_2._M_allocated_capacity._1_7_,
                                 emulatorExe.field_2._M_local_buf[0]) + 1);
      }
      if ((cmCompiledGeneratorExpression *)local_c8._0_8_ !=
          (cmCompiledGeneratorExpression *)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
      }
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&emulatorWithArgs);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var13);
  }
  GenerateInternalProperties(local_a8,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  std::ios::widen((char)os->_vptr_basic_ostream[-3] + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exe._M_dataplus._M_p != &exe.field_2) {
    operator_delete(exe._M_dataplus._M_p,exe.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(this->Test->GetBacktrace());

  // Start the test command.
  os << indent << "add_test(" << this->Test->GetName() << " ";

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = command[0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(exe);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE) {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    // Prepend with the emulator when cross compiling if required.
    const char* emulator = target->GetProperty("CROSSCOMPILING_EMULATOR");
    if (emulator != nullptr && *emulator) {
      std::vector<std::string> emulatorWithArgs;
      cmSystemTools::ExpandListArgument(emulator, emulatorWithArgs);
      std::string emulatorExe(emulatorWithArgs[0]);
      cmSystemTools::ConvertToUnixSlashes(emulatorExe);
      os << cmOutputConverter::EscapeForCMake(emulatorExe) << " ";
      for (std::string const& arg : cmMakeRange(emulatorWithArgs).advance(1)) {
        os << cmOutputConverter::EscapeForCMake(arg) << " ";
      }
    }
  } else {
    // Use the command name given.
    exe = ge.Parse(exe)->Evaluate(this->LG, config);
    cmSystemTools::ConvertToUnixSlashes(exe);
  }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);
  for (std::string const& arg : cmMakeRange(command).advance(1)) {
    os << " "
       << cmOutputConverter::EscapeForCMake(
            ge.Parse(arg)->Evaluate(this->LG, config));
  }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  cmPropertyMap& pm = this->Test->GetProperties();
  os << indent << "set_tests_properties(" << this->Test->GetName()
     << " PROPERTIES ";
  for (auto const& i : pm) {
    os << " " << i.first << " "
       << cmOutputConverter::EscapeForCMake(
            ge.Parse(i.second.GetValue())->Evaluate(this->LG, config));
  }
  this->GenerateInternalProperties(os);
  os << ")" << std::endl;
}